

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

Leaf * __thiscall
kj::_::BTreeImpl::insertHelper<kj::_::BTreeImpl::Leaf>
          (BTreeImpl *this,SearchKey *searchKey,Leaf *node,Parent *parent,uint indexInParent,
          uint pos)

{
  NodeUnion *pNVar1;
  uint dstPos;
  uint uVar2;
  int iVar3;
  Leaf *dst;
  AllocResult<kj::_::BTreeImpl::Leaf> AVar4;
  
  if (node->rows[0xd].i != 0) {
    AVar4 = alloc<kj::_::BTreeImpl::Leaf>(this);
    dst = AVar4.node;
    dstPos = AVar4.index;
    if (parent == (Parent *)0x0) {
      AVar4 = alloc<kj::_::BTreeImpl::Leaf>(this);
      uVar2 = split(this,AVar4.node,AVar4.index,node,pos);
      move(this,dst,dstPos,node);
      pNVar1 = this->tree;
      (pNVar1->field_0).freelist.zero[0] = uVar2 + 1;
      (pNVar1->field_0).freelist.zero[7] = dstPos;
      (pNVar1->field_0).freelist.zero[8] = AVar4.index;
      *(undefined8 *)((long)&pNVar1->field_0 + 8) = 0;
      *(undefined8 *)((long)&pNVar1->field_0 + 0x10) = 0;
      *(undefined8 *)((long)&pNVar1->field_0 + 0x18) = 0;
      *(undefined8 *)((long)&pNVar1->field_0 + 0x28) = 0;
      *(undefined8 *)((long)&pNVar1->field_0 + 0x30) = 0;
      *(undefined8 *)((long)&pNVar1->field_0 + 0x38) = 0;
      this->height = this->height + 1;
      iVar3 = (*searchKey->_vptr_SearchKey[2])(searchKey,(ulong)uVar2);
      node = dst;
      if ((char)iVar3 != '\0') {
        node = AVar4.node;
      }
    }
    else {
      uVar2 = split(this,dst,dstPos,node,pos);
      Parent::insertAfter(parent,indexInParent,uVar2,dstPos);
      iVar3 = (*searchKey->_vptr_SearchKey[2])(searchKey,(ulong)uVar2);
      if ((char)iVar3 != '\0') {
        node = dst;
      }
    }
  }
  return node;
}

Assistant:

Node& BTreeImpl::insertHelper(const SearchKey& searchKey,
    Node& node, Parent* parent, uint indexInParent, uint pos) {
  if (node.isFull()) {
    // This node is full. Need to split.
    if (parent == nullptr) {
      // This is the root node. We need to split into two nodes and create a new root.
      auto n1 = alloc<Node>();
      auto n2 = alloc<Node>();

      uint pivot = split(n2.node, n2.index, node, pos);
      move(n1.node, n1.index, node);

      // Rewrite root to have the two children.
      tree[0].parent.initRoot(pivot, n1.index, n2.index);

      // Increased height.
      ++height;

      // Decide which new branch has our search key.
      if (searchKey.isAfter(pivot)) {
        // the right one
        return n2.node;
      } else {
        // the left one
        return n1.node;
      }
    } else {
      // This is a non-root parent node. We need to split it into two and insert the new node
      // into the grandparent.
      auto n = alloc<Node>();
      uint pivot = split(n.node, n.index, node, pos);

      // Insert new child into grandparent.
      parent->insertAfter(indexInParent, pivot, n.index);

      // Decide which new branch has our search key.
      if (searchKey.isAfter(pivot)) {
        // the new one, which is right of the original
        return n.node;
      } else {
        // the original one, which is left of the new one
        return node;
      }
    }
  } else {
    // No split needed.
    return node;
  }
}